

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O1

bool Assimp::GetNextLine<char>(char **buffer,char *out)

{
  char cVar1;
  byte *pbVar2;
  ulong uVar3;
  
  cVar1 = **buffer;
  if (cVar1 != '\0') {
    for (uVar3 = 0;
        (pbVar2 = (byte *)*buffer, (*pbVar2 < 0xe & (byte)(0x3401 >> (*pbVar2 & 0x1f))) == 0 &&
        (uVar3 < 0x1000)); uVar3 = uVar3 + 1) {
      *buffer = (char *)(pbVar2 + 1);
      out[uVar3] = *pbVar2;
    }
    out[uVar3] = '\0';
    pbVar2 = (byte *)*buffer;
    while( true ) {
      if ((0xd < *pbVar2) || ((0x3400U >> (*pbVar2 & 0x1f) & 1) == 0)) break;
      *buffer = (char *)(pbVar2 + 1);
      pbVar2 = pbVar2 + 1;
    }
  }
  return cVar1 != '\0';
}

Assistant:

AI_FORCE_INLINE
bool GetNextLine( const char_t*& buffer, char_t out[ BufferSize ] ) {
    if( ( char_t )'\0' == *buffer ) {
        return false;
    }

    char* _out = out;
    char* const end = _out + BufferSize;
    while( !IsLineEnd( *buffer ) && _out < end ) {
        *_out++ = *buffer++;
    }
    *_out = (char_t)'\0';

    while( IsLineEnd( *buffer ) && '\0' != *buffer ) {
        ++buffer;
    }

    return true;
}